

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

int fprintfBz2Aig(bz2file *b,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap_1;
  undefined4 local_48;
  int n;
  va_list ap;
  int bzError;
  char *newBuf;
  char *fmt_local;
  bz2file *b_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (b->b == (BZFILE *)0x0) {
    ap_1[0].overflow_arg_area = local_118;
    ap_1[0]._0_8_ = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x10;
    b_local._4_4_ = vfprintf((FILE *)b->f,fmt,&local_68);
  }
  else {
    while( true ) {
      ap[0].overflow_arg_area = local_118;
      ap[0]._0_8_ = &stack0x00000008;
      n = 0x30;
      local_48 = 0x10;
      iVar1 = vsnprintf(b->buf,(long)b->nBytesMax,fmt,&local_48);
      b->nBytes = iVar1;
      if ((-1 < b->nBytes) && (b->nBytes < b->nBytesMax)) {
        BZ2_bzWrite((int *)((long)&ap[0].reg_save_area + 4),b->b,b->buf,b->nBytes);
        if (ap[0].reg_save_area._4_4_ == -6) {
          fprintf(_stdout,"Ioa_WriteBlif(): I/O error writing to compressed stream.\n");
          return -1;
        }
        return b->nBytes;
      }
      if (b->nBytes < 0) {
        b->nBytesMax = b->nBytesMax << 1;
      }
      else {
        b->nBytesMax = b->nBytes + 1;
      }
      if (b->buf == (char *)0x0) {
        local_120 = (char *)malloc((long)b->nBytesMax);
      }
      else {
        local_120 = (char *)realloc(b->buf,(long)b->nBytesMax);
      }
      if (local_120 == (char *)0x0) break;
      b->buf = local_120;
    }
    b_local._4_4_ = -1;
  }
  return b_local._4_4_;
}

Assistant:

int fprintfBz2Aig( bz2file * b, char * fmt, ... ) {
    if (b->b) {
        char * newBuf;
        int bzError;
        va_list ap;
        while (1) {
            va_start(ap,fmt);
            b->nBytes = vsnprintf(b->buf,b->nBytesMax,fmt,ap);
            va_end(ap);
            if (b->nBytes > -1 && b->nBytes < b->nBytesMax)
                break;
            if (b->nBytes > -1)
                b->nBytesMax = b->nBytes + 1;
            else
                b->nBytesMax *= 2;
            if ((newBuf = ABC_REALLOC( char,b->buf,b->nBytesMax )) == NULL)
                return -1;
            else
                b->buf = newBuf;
        }
        BZ2_bzWrite( &bzError, b->b, b->buf, b->nBytes );
        if (bzError == BZ_IO_ERROR) {
            fprintf( stdout, "Ioa_WriteBlif(): I/O error writing to compressed stream.\n" );
            return -1;
        }
        return b->nBytes;
    } else {
        int n;
        va_list ap;
        va_start(ap,fmt);
        n = vfprintf( b->f, fmt, ap);
        va_end(ap);
        return n;
    }
}